

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd2topng.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  FILE *pFVar5;
  long lVar6;
  char *__ptr;
  size_t sStack_40;
  
  if ((argc & 0xfffffffbU) == 3) {
    iVar1 = 0;
    iVar2 = 0;
    iVar3 = 0;
    iVar4 = 0;
    if (argc == 7) {
      iVar1 = atoi(argv[3]);
      iVar2 = atoi(argv[4]);
      iVar3 = atoi(argv[5]);
      iVar4 = atoi(argv[6]);
    }
    pFVar5 = fopen(argv[1],"rb");
    if (pFVar5 == (FILE *)0x0) {
      __ptr = "Input file does not exist!\n";
      sStack_40 = 0x1b;
    }
    else {
      if (argc == 7) {
        lVar6 = gdImageCreateFromGd2Part(pFVar5,iVar1,iVar2,iVar3,iVar4);
      }
      else {
        lVar6 = gdImageCreateFromGd2(pFVar5);
      }
      fclose(pFVar5);
      if (lVar6 != 0) {
        pFVar5 = fopen(argv[2],"wb");
        if (pFVar5 != (FILE *)0x0) {
          fwrite("No PNG library support available.\n",0x22,1,_stderr);
          fclose(pFVar5);
          gdImageDestroy(lVar6);
          return 0;
        }
        fwrite("Output file cannot be written to!\n",0x22,1,_stderr);
        gdImageDestroy(lVar6);
        goto LAB_00101347;
      }
      __ptr = "Input is not in GD2 format!\n";
      sStack_40 = 0x1c;
    }
  }
  else {
    fwrite("Usage: gd2topng filename.gd2 filename.png [srcx srcy width height]\n",0x43,1,_stderr);
    __ptr = "If the coordinates are absent,t he entire image is converted.\n";
    sStack_40 = 0x3e;
  }
  fwrite(__ptr,sStack_40,1,_stderr);
LAB_00101347:
  exit(1);
}

Assistant:

int
main (int argc, char **argv)
{
	gdImagePtr im;
	FILE *in, *out;
	int x=0, y=0, w=0, h=0;
	if ((argc != 3) && (argc != 7)) {
		fprintf (stderr,
		         "Usage: gd2topng filename.gd2 filename.png [srcx srcy width height]\n");
		fprintf (stderr,
		         "If the coordinates are absent,t he entire image is converted.\n");
		exit (1);
	}
	if (argc == 7) {
		x = atoi (argv[3]);
		y = atoi (argv[4]);
		w = atoi (argv[5]);
		h = atoi (argv[6]);
	}
	in = fopen (argv[1], "rb");
	if (!in) {
		fprintf(stderr, "Input file does not exist!\n");
		exit (1);
	}
	if (argc == 7) {
		im = gdImageCreateFromGd2Part (in, x, y, w, h);
	} else {
		im = gdImageCreateFromGd2 (in);
	}
	fclose (in);
	if (!im) {
		fprintf(stderr, "Input is not in GD2 format!\n");
		exit (1);
	}
	out = fopen (argv[2], "wb");
	if (!out) {
		fprintf(stderr, "Output file cannot be written to!\n");
		gdImageDestroy (im);
		exit (1);
	}
#ifdef HAVE_LIBPNG
	gdImagePng (im, out);
#else
	fprintf(stderr, "No PNG library support available.\n");
#endif
	fclose (out);
	gdImageDestroy (im);

	return 0;
}